

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

bool ON_MeshParameters_AreValid(void)

{
  ON__UINT64 OVar1;
  Type TVar2;
  double dVar3;
  undefined1 local_f8 [8];
  ON_MeshParameters mp;
  double normalized_mesh_density;
  
  TVar2 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::DefaultMesh);
  if (TVar2 == Default) {
    TVar2 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::FastRenderMesh);
    if (TVar2 == FastRender) {
      TVar2 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::QualityRenderMesh);
      if (TVar2 == QualityRender) {
        TVar2 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::DefaultAnalysisMesh);
        if (TVar2 == DefaultAnalysis) {
          for (mp.m_reserved6 = 0; (double)mp.m_reserved6 <= 1.0;
              mp.m_reserved6 = (ON__UINT64)((double)mp.m_reserved6 + 0.125)) {
            ON_MeshParameters::CreateFromMeshDensity
                      ((ON_MeshParameters *)local_f8,(double)mp.m_reserved6);
            TVar2 = ON_MeshParameters::GeometrySettingsType((ON_MeshParameters *)local_f8);
            OVar1 = mp.m_reserved6;
            if (TVar2 != FromMeshDensity) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
                         ,0x4ed,"",
                         "ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).GeometrySettingsType() returned an unexpected value."
                        );
              return false;
            }
            dVar3 = ON_MeshParameters::MeshDensity((ON_MeshParameters *)local_f8);
            if (((double)OVar1 != dVar3) || (NAN((double)OVar1) || NAN(dVar3))) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
                         ,0x4f2,"",
                         "ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).MeshDensity() returned an unexpected value."
                        );
              return false;
            }
          }
          normalized_mesh_density._7_1_ = true;
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
                     ,0x4e5,"",
                     "ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsType() returned an unexpected value."
                    );
          normalized_mesh_density._7_1_ = false;
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
                   ,0x4e0,"",
                   "ON_MeshParameters::QualityRenderMesh.GeometrySettingsType() returned an unexpected value."
                  );
        normalized_mesh_density._7_1_ = false;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
                 ,0x4db,"",
                 "ON_MeshParameters::FastRenderMesh.GeometrySettingsType() returned an unexpected value."
                );
      normalized_mesh_density._7_1_ = false;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
               ,0x4d6,"",
               "ON_MeshParameters::DefaultMesh.GeometrySettingsType() returned an unexpected value."
              );
    normalized_mesh_density._7_1_ = false;
  }
  return normalized_mesh_density._7_1_;
}

Assistant:

bool ON_MeshParameters_AreValid()
{
  // This is a validation test to insure the code that sets default mesh parameters
  // and the code that detects default mesh parameters works correctly.
  // This validation test passes as of November 2020. If ON_ERROR() is called in this function
  // it means new bugs have been introduced. These need to be fixed immediately in order to
  // keep the code that generates display meshes working properly.
  if (ON_MeshParameters::Type::Default != ON_MeshParameters::DefaultMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::DefaultMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  if (ON_MeshParameters::Type::FastRender != ON_MeshParameters::FastRenderMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::FastRenderMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  if (ON_MeshParameters::Type::QualityRender != ON_MeshParameters::QualityRenderMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::QualityRenderMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  if (ON_MeshParameters::Type::DefaultAnalysis != ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  for (double normalized_mesh_density = 0.0; normalized_mesh_density <= 1.0; normalized_mesh_density += 0.125)
  {
    const ON_MeshParameters mp = ON_MeshParameters::CreateFromMeshDensity(normalized_mesh_density);
    if (ON_MeshParameters::Type::FromMeshDensity != mp.GeometrySettingsType())
    {
      ON_ERROR("ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).GeometrySettingsType() returned an unexpected value.");
      return false;
    }
    if (normalized_mesh_density != mp.MeshDensity())
    {
      ON_ERROR("ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).MeshDensity() returned an unexpected value.");
      return false;
    }
  }
  return true;
}